

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleDumperPretty.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  uint8_t *start;
  ostream *poVar1;
  exception *ex;
  StringSink sink;
  string buffer;
  Options dumperOptions;
  Slice s;
  Builder b;
  undefined4 in_stack_fffffffffffffd38;
  undefined2 in_stack_fffffffffffffd3c;
  ValueType in_stack_fffffffffffffd3e;
  undefined1 in_stack_fffffffffffffd3f;
  Builder *in_stack_fffffffffffffd40;
  undefined6 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4e;
  ValueType in_stack_fffffffffffffd4f;
  Builder *in_stack_fffffffffffffd50;
  Sink *in_stack_fffffffffffffd58;
  Slice in_stack_fffffffffffffd60;
  Builder *in_stack_fffffffffffffd70;
  string local_1f0 [58];
  undefined1 local_1b6;
  Slice local_1a0 [51];
  int local_4;
  
  local_4 = 0;
  arangodb::velocypack::Builder::Builder(in_stack_fffffffffffffd70);
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4f,
             (bool)in_stack_fffffffffffffd4e);
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd40,
             (Value *)CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ))));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd50,
             (char *)CONCAT17(in_stack_fffffffffffffd4f,
                              CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd40,
             CONCAT13(in_stack_fffffffffffffd3f,
                      CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)),
             (ValueType)((uint)in_stack_fffffffffffffd38 >> 0x18));
  attrName._M_str = (char *)in_stack_fffffffffffffd60._start;
  attrName._M_len = (size_t)in_stack_fffffffffffffd58;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd50,attrName,
             (Value *)CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd50,
             (char *)CONCAT17(in_stack_fffffffffffffd4f,
                              CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd40,(bool)in_stack_fffffffffffffd3f,
             in_stack_fffffffffffffd3e);
  attrName_00._M_str = (char *)in_stack_fffffffffffffd60._start;
  attrName_00._M_len = (size_t)in_stack_fffffffffffffd58;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd50,attrName_00,
             (Value *)CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd50,
             (char *)CONCAT17(in_stack_fffffffffffffd4f,
                              CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4f,
             (bool)in_stack_fffffffffffffd4e);
  attrName_01._M_str = (char *)in_stack_fffffffffffffd60._start;
  attrName_01._M_len = (size_t)in_stack_fffffffffffffd58;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd50,attrName_01,
             (Value *)CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd40,
             CONCAT13(in_stack_fffffffffffffd3f,
                      CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)),
             (ValueType)((uint)in_stack_fffffffffffffd38 >> 0x18));
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd40,
             (Value *)CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ))));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd40,
             CONCAT13(in_stack_fffffffffffffd3f,
                      CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)),
             (ValueType)((uint)in_stack_fffffffffffffd38 >> 0x18));
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd40,
             (Value *)CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ))));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd40,
             CONCAT13(in_stack_fffffffffffffd3f,
                      CONCAT12(in_stack_fffffffffffffd3e,in_stack_fffffffffffffd3c)),
             (ValueType)((uint)in_stack_fffffffffffffd38 >> 0x18));
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd40,
             (Value *)CONCAT17(in_stack_fffffffffffffd3f,
                               CONCAT16(in_stack_fffffffffffffd3e,
                                        CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                                                ))));
  arangodb::velocypack::Builder::operator()(in_stack_fffffffffffffd40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd50,
             (char *)CONCAT17(in_stack_fffffffffffffd4f,
                              CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  arangodb::velocypack::Value::Value
            ((Value *)in_stack_fffffffffffffd40,
             (char *)CONCAT17(in_stack_fffffffffffffd3f,
                              CONCAT16(in_stack_fffffffffffffd3e,
                                       CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
                                      )),None);
  attrName_02._M_str = (char *)in_stack_fffffffffffffd60._start;
  attrName_02._M_len = (size_t)in_stack_fffffffffffffd58;
  arangodb::velocypack::Builder::operator()
            (in_stack_fffffffffffffd50,attrName_02,
             (Value *)CONCAT17(in_stack_fffffffffffffd4f,
                               CONCAT16(in_stack_fffffffffffffd4e,in_stack_fffffffffffffd48)));
  arangodb::velocypack::Builder::operator()(in_stack_fffffffffffffd40);
  start = arangodb::velocypack::Builder::start(in_stack_fffffffffffffd40);
  arangodb::velocypack::Slice::Slice(local_1a0,start);
  arangodb::velocypack::Options::Options((Options *)in_stack_fffffffffffffd40);
  local_1b6 = 1;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd60._start);
  arangodb::velocypack::
  StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StringSinkImpl((StringSinkImpl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffd40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffd3f,
                          CONCAT16(in_stack_fffffffffffffd3e,
                                   CONCAT24(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))));
  arangodb::velocypack::Dumper::dump
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (Options *)in_stack_fffffffffffffd50);
  poVar1 = std::operator<<((ostream *)&std::cout,"Resulting JSON:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,local_1f0);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffd40);
  arangodb::velocypack::Builder::~Builder(in_stack_fffffffffffffd40);
  return local_4;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  Builder b;
  // build an object with attribute names "b", "a", "l", "name"
  b(Value(ValueType::Object))("b", Value(12))("a", Value(true))(
      "l", Value(ValueType::Array))(Value(1))(Value(2))(Value(3))()(
      "name", Value("Gustav"))();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  Options dumperOptions;
  dumperOptions.prettyPrint = true;
  // now dump the Slice into an std::string
  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(s, &sink, &dumperOptions);

  // and print it
  std::cout << "Resulting JSON:" << std::endl << buffer << std::endl;

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}